

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O2

pointer_type __thiscall
cppcms::impl::
func_to_handler<booster::callback<void(cppcms::http::context::completion_type)>,cppcms::http::context::completion_type>
          (impl *this,callback<void_(cppcms::http::context::completion_type)> *f,anon_enum_32 *p1)

{
  handler_fbinder_p1<booster::callback<void_(cppcms::http::context::completion_type)>,_cppcms::http::context::completion_type>
  *this_00;
  
  this_00 = (handler_fbinder_p1<booster::callback<void_(cppcms::http::context::completion_type)>,_cppcms::http::context::completion_type>
             *)operator_new(0x20);
  handler_fbinder_p1<booster::callback<void_(cppcms::http::context::completion_type)>,_cppcms::http::context::completion_type>
  ::handler_fbinder_p1(this_00,f,p1);
  *(handler_fbinder_p1<booster::callback<void_(cppcms::http::context::completion_type)>,_cppcms::http::context::completion_type>
    **)this = this_00;
  booster::atomic_counter::inc();
  return (pointer_type)(callable<void_()> *)this;
}

Assistant:

booster::aio::handler::pointer_type func_to_handler(C const &f,P1 const &p1)
{
	return new handler_fbinder_p1<C,P1>(f,p1);
}